

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::avx::FlatLinearCurveMiMBIntersectorK<4,_8,_true>::occluded
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  ulong uVar35;
  bool bVar36;
  float fVar37;
  float fVar43;
  float fVar44;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar45;
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  float fVar46;
  float fVar51;
  float fVar52;
  undefined1 auVar47 [16];
  float fVar53;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  float fVar54;
  float fVar58;
  float fVar59;
  undefined1 auVar55 [16];
  float fVar60;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  undefined1 local_310 [8];
  float fStack_308;
  float fStack_304;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  Primitive *local_278;
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [16];
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  undefined1 local_210 [16];
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  
  pSVar10 = context->scene;
  uVar31 = line->sharedGeomID;
  uVar6 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar31].ptr;
  fVar46 = (pGVar11->time_range).lower;
  fVar46 = pGVar11->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0xe0) - fVar46) / ((pGVar11->time_range).upper - fVar46));
  auVar17 = vroundss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),9);
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar63 = vmaxss_avx(ZEXT816(0) << 0x20,auVar17);
  lVar32 = *(long *)&pGVar11[3].time_range.upper;
  lVar33 = (long)(int)auVar63._0_4_ * 0x38;
  lVar12 = *(long *)(lVar32 + lVar33);
  lVar13 = *(long *)(lVar32 + 0x10 + lVar33);
  auVar17 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar6);
  uVar7 = (line->v0).field_0.i[1];
  auVar47 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar7);
  uVar8 = (line->v0).field_0.i[2];
  auVar38 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar8);
  uVar9 = (line->v0).field_0.i[3];
  auVar4 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)uVar9);
  auVar5 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar6 + 1));
  auVar39 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar7 + 1));
  auVar40 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar8 + 1));
  auVar48 = *(undefined1 (*) [16])(lVar12 + lVar13 * (ulong)(uVar9 + 1));
  lVar12 = *(long *)(lVar32 + 0x38 + lVar33);
  lVar32 = *(long *)(lVar32 + 0x48 + lVar33);
  auVar49 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar6 * lVar32);
  auVar55 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar7 * lVar32);
  auVar56 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar8 * lVar32);
  auVar57 = *(undefined1 (*) [16])(lVar12 + (ulong)uVar9 * lVar32);
  auVar61 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar6 + 1) * lVar32);
  auVar62 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar8 + 1) * lVar32);
  fVar46 = fVar46 - auVar63._0_4_;
  auVar63 = vunpcklps_avx(auVar17,auVar38);
  auVar17 = vunpckhps_avx(auVar17,auVar38);
  auVar38 = vunpcklps_avx(auVar47,auVar4);
  auVar47 = vunpckhps_avx(auVar47,auVar4);
  auVar64 = vunpcklps_avx(auVar63,auVar38);
  auVar38 = vunpckhps_avx(auVar63,auVar38);
  auVar63 = vunpcklps_avx(auVar17,auVar47);
  auVar4 = vunpckhps_avx(auVar17,auVar47);
  auVar65 = vunpcklps_avx(auVar5,auVar40);
  auVar17 = vunpckhps_avx(auVar5,auVar40);
  auVar5 = vunpcklps_avx(auVar39,auVar48);
  auVar47 = vunpckhps_avx(auVar39,auVar48);
  auVar66 = vunpcklps_avx(auVar65,auVar5);
  auVar5 = vunpckhps_avx(auVar65,auVar5);
  auVar65 = vunpcklps_avx(auVar17,auVar47);
  auVar39 = vunpckhps_avx(auVar17,auVar47);
  auVar40 = vunpcklps_avx(auVar49,auVar56);
  auVar17 = vunpckhps_avx(auVar49,auVar56);
  auVar48 = vunpcklps_avx(auVar55,auVar57);
  auVar47 = vunpckhps_avx(auVar55,auVar57);
  auVar56 = vunpcklps_avx(auVar40,auVar48);
  auVar40 = vunpckhps_avx(auVar40,auVar48);
  auVar57 = vunpcklps_avx(auVar17,auVar47);
  auVar48 = vunpckhps_avx(auVar17,auVar47);
  auVar55 = vunpcklps_avx(auVar61,auVar62);
  auVar49 = vunpckhps_avx(auVar61,auVar62);
  auVar17 = *(undefined1 (*) [16])(lVar12 + (ulong)(uVar7 + 1) * lVar32);
  auVar47 = *(undefined1 (*) [16])(lVar12 + lVar32 * (ulong)(uVar9 + 1));
  auVar61 = vunpcklps_avx(auVar17,auVar47);
  auVar17 = vunpckhps_avx(auVar17,auVar47);
  auVar62 = vunpcklps_avx(auVar55,auVar61);
  auVar55 = vunpckhps_avx(auVar55,auVar61);
  auVar61 = vunpcklps_avx(auVar49,auVar17);
  auVar49 = vunpckhps_avx(auVar49,auVar17);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),0);
  auVar47 = vshufps_avx(ZEXT416((uint)(1.0 - fVar46)),ZEXT416((uint)(1.0 - fVar46)),0);
  fVar45 = auVar17._0_4_;
  fVar51 = auVar17._4_4_;
  fVar52 = auVar17._8_4_;
  fVar53 = auVar17._12_4_;
  local_2e0._0_4_ = auVar64._0_4_;
  local_2e0._4_4_ = auVar64._4_4_;
  fStack_2d8 = auVar64._8_4_;
  fStack_2d4 = auVar64._12_4_;
  fVar46 = auVar47._0_4_;
  fVar37 = auVar47._4_4_;
  fVar43 = auVar47._8_4_;
  fVar44 = auVar47._12_4_;
  local_2e0._4_4_ = fVar51 * auVar56._4_4_ + fVar37 * (float)local_2e0._4_4_;
  local_2e0._0_4_ = fVar45 * auVar56._0_4_ + fVar46 * (float)local_2e0._0_4_;
  fStack_2d8 = fVar52 * auVar56._8_4_ + fVar43 * fStack_2d8;
  fStack_2d4 = fVar53 * auVar56._12_4_ + fVar44 * fStack_2d4;
  local_290._0_4_ = fVar46 * auVar38._0_4_ + fVar45 * auVar40._0_4_;
  local_290._4_4_ = fVar37 * auVar38._4_4_ + fVar51 * auVar40._4_4_;
  local_290._8_4_ = fVar43 * auVar38._8_4_ + fVar52 * auVar40._8_4_;
  local_290._12_4_ = fVar44 * auVar38._12_4_ + fVar53 * auVar40._12_4_;
  local_310._0_4_ = auVar63._0_4_;
  local_310._4_4_ = auVar63._4_4_;
  fStack_308 = auVar63._8_4_;
  fStack_304 = auVar63._12_4_;
  local_240._0_4_ = fVar46 * (float)local_310._0_4_ + fVar45 * auVar57._0_4_;
  local_240._4_4_ = fVar37 * (float)local_310._4_4_ + fVar51 * auVar57._4_4_;
  local_240._8_4_ = fVar43 * fStack_308 + fVar52 * auVar57._8_4_;
  local_240._12_4_ = fVar44 * fStack_304 + fVar53 * auVar57._12_4_;
  local_200 = auVar4._0_4_ * fVar46 + fVar45 * auVar48._0_4_;
  fStack_1fc = auVar4._4_4_ * fVar37 + fVar51 * auVar48._4_4_;
  fStack_1f8 = auVar4._8_4_ * fVar43 + fVar52 * auVar48._8_4_;
  fStack_1f4 = auVar4._12_4_ * fVar44 + fVar53 * auVar48._12_4_;
  local_220 = auVar66._0_4_ * fVar46 + fVar45 * auVar62._0_4_;
  fStack_21c = auVar66._4_4_ * fVar37 + fVar51 * auVar62._4_4_;
  fStack_218 = auVar66._8_4_ * fVar43 + fVar52 * auVar62._8_4_;
  fStack_214 = auVar66._12_4_ * fVar44 + fVar53 * auVar62._12_4_;
  local_230 = fVar46 * auVar5._0_4_ + fVar45 * auVar55._0_4_;
  fStack_22c = fVar37 * auVar5._4_4_ + fVar51 * auVar55._4_4_;
  fStack_228 = fVar43 * auVar5._8_4_ + fVar52 * auVar55._8_4_;
  fStack_224 = fVar44 * auVar5._12_4_ + fVar53 * auVar55._12_4_;
  local_310._4_4_ = auVar65._4_4_ * fVar37 + fVar51 * auVar61._4_4_;
  local_310._0_4_ = auVar65._0_4_ * fVar46 + fVar45 * auVar61._0_4_;
  fStack_308 = auVar65._8_4_ * fVar43 + fVar52 * auVar61._8_4_;
  fStack_304 = auVar65._12_4_ * fVar44 + fVar53 * auVar61._12_4_;
  local_2a0._0_4_ = auVar39._0_4_;
  local_2a0._4_4_ = auVar39._4_4_;
  fStack_298 = auVar39._8_4_;
  fStack_294 = auVar39._12_4_;
  local_210._0_4_ = fVar45 * auVar49._0_4_ + fVar46 * (float)local_2a0._0_4_;
  local_210._4_4_ = fVar51 * auVar49._4_4_ + fVar37 * (float)local_2a0._4_4_;
  local_210._8_4_ = fVar52 * auVar49._8_4_ + fVar43 * fStack_298;
  local_210._12_4_ = fVar53 * auVar49._12_4_ + fVar44 * fStack_294;
  auVar17 = vpcmpeqd_avx(local_210,local_210);
  _local_2a0 = vpcmpeqd_avx(auVar17,(undefined1  [16])(line->primIDs).field_0);
  local_1f0 = vshufps_avx(ZEXT416(uVar31),ZEXT416(uVar31),0);
  fVar46 = pre->ray_space[k].vy.field_0.m128[0];
  fVar37 = pre->ray_space[k].vz.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar81._4_4_ = uVar1;
  auVar81._0_4_ = uVar1;
  auVar81._8_4_ = uVar1;
  auVar81._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar17 = vsubps_avx(local_290,auVar81);
  auVar47 = vsubps_avx(local_240,auVar38);
  fVar58 = auVar47._0_4_;
  fVar60 = auVar47._4_4_;
  fVar78 = auVar47._8_4_;
  fVar80 = auVar47._12_4_;
  fVar59 = auVar17._0_4_;
  fVar77 = auVar17._4_4_;
  fVar79 = auVar17._8_4_;
  fVar16 = auVar17._12_4_;
  fVar43 = pre->ray_space[k].vy.field_0.m128[1];
  fVar44 = pre->ray_space[k].vz.field_0.m128[1];
  fVar45 = pre->ray_space[k].vz.field_0.m128[2];
  fVar51 = pre->ray_space[k].vy.field_0.m128[2];
  fVar52 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar82._4_4_ = uVar1;
  auVar82._0_4_ = uVar1;
  auVar82._8_4_ = uVar1;
  auVar82._12_4_ = uVar1;
  auVar17 = vsubps_avx(_local_2e0,auVar82);
  fVar72 = auVar17._0_4_;
  fVar74 = auVar17._4_4_;
  fVar75 = auVar17._8_4_;
  fVar76 = auVar17._12_4_;
  auVar69._0_4_ = fVar46 * fVar59 + fVar37 * fVar58 + fVar72 * fVar52;
  auVar69._4_4_ = fVar46 * fVar77 + fVar37 * fVar60 + fVar74 * fVar52;
  auVar69._8_4_ = fVar46 * fVar79 + fVar37 * fVar78 + fVar75 * fVar52;
  auVar69._12_4_ = fVar46 * fVar16 + fVar37 * fVar80 + fVar76 * fVar52;
  fVar53 = pre->ray_space[k].vx.field_0.m128[1];
  auVar71._0_4_ = fVar43 * fVar59 + fVar44 * fVar58 + fVar72 * fVar53;
  auVar71._4_4_ = fVar43 * fVar77 + fVar44 * fVar60 + fVar74 * fVar53;
  auVar71._8_4_ = fVar43 * fVar79 + fVar44 * fVar78 + fVar75 * fVar53;
  auVar71._12_4_ = fVar43 * fVar16 + fVar44 * fVar80 + fVar76 * fVar53;
  fVar54 = pre->ray_space[k].vx.field_0.m128[2];
  auVar73._0_4_ = fVar72 * fVar54 + fVar51 * fVar59 + fVar45 * fVar58;
  auVar73._4_4_ = fVar74 * fVar54 + fVar51 * fVar77 + fVar45 * fVar60;
  auVar73._8_4_ = fVar75 * fVar54 + fVar51 * fVar79 + fVar45 * fVar78;
  auVar73._12_4_ = fVar76 * fVar54 + fVar51 * fVar16 + fVar45 * fVar80;
  auVar17 = vsubps_avx(_local_310,auVar38);
  fVar58 = auVar17._0_4_;
  fVar77 = auVar17._4_4_;
  fVar80 = auVar17._8_4_;
  fVar74 = auVar17._12_4_;
  auVar4._4_4_ = fStack_22c;
  auVar4._0_4_ = local_230;
  auVar4._8_4_ = fStack_228;
  auVar4._12_4_ = fStack_224;
  auVar17 = vsubps_avx(auVar4,auVar81);
  fVar59 = auVar17._0_4_;
  fVar78 = auVar17._4_4_;
  fVar16 = auVar17._8_4_;
  fVar75 = auVar17._12_4_;
  auVar5._4_4_ = fStack_21c;
  auVar5._0_4_ = local_220;
  auVar5._8_4_ = fStack_218;
  auVar5._12_4_ = fStack_214;
  auVar17 = vsubps_avx(auVar5,auVar82);
  fVar60 = auVar17._0_4_;
  fVar79 = auVar17._4_4_;
  fVar72 = auVar17._8_4_;
  fVar76 = auVar17._12_4_;
  auVar47._0_4_ = fVar52 * fVar60 + fVar46 * fVar59 + fVar37 * fVar58;
  auVar47._4_4_ = fVar52 * fVar79 + fVar46 * fVar78 + fVar37 * fVar77;
  auVar47._8_4_ = fVar52 * fVar72 + fVar46 * fVar16 + fVar37 * fVar80;
  auVar47._12_4_ = fVar52 * fVar76 + fVar46 * fVar75 + fVar37 * fVar74;
  auVar55._0_4_ = fVar53 * fVar60 + fVar59 * fVar43 + fVar44 * fVar58;
  auVar55._4_4_ = fVar53 * fVar79 + fVar78 * fVar43 + fVar44 * fVar77;
  auVar55._8_4_ = fVar53 * fVar72 + fVar16 * fVar43 + fVar44 * fVar80;
  auVar55._12_4_ = fVar53 * fVar76 + fVar75 * fVar43 + fVar44 * fVar74;
  auVar39._0_4_ = fVar54 * fVar60 + fVar59 * fVar51 + fVar45 * fVar58;
  auVar39._4_4_ = fVar54 * fVar79 + fVar78 * fVar51 + fVar45 * fVar77;
  auVar39._8_4_ = fVar54 * fVar72 + fVar16 * fVar51 + fVar45 * fVar80;
  auVar39._12_4_ = fVar54 * fVar76 + fVar75 * fVar51 + fVar45 * fVar74;
  auVar17 = vsubps_avx(auVar47,auVar69);
  auVar47 = vsubps_avx(auVar55,auVar71);
  fVar45 = auVar47._0_4_;
  auVar61._0_4_ = fVar45 * -auVar71._0_4_;
  fVar58 = auVar47._4_4_;
  auVar61._4_4_ = fVar58 * -auVar71._4_4_;
  fVar59 = auVar47._8_4_;
  auVar61._8_4_ = fVar59 * -auVar71._8_4_;
  fVar60 = auVar47._12_4_;
  auVar61._12_4_ = fVar60 * -auVar71._12_4_;
  fVar46 = auVar17._0_4_;
  auVar63._0_4_ = auVar69._0_4_ * fVar46;
  fVar37 = auVar17._4_4_;
  auVar63._4_4_ = auVar69._4_4_ * fVar37;
  fVar43 = auVar17._8_4_;
  auVar63._8_4_ = auVar69._8_4_ * fVar43;
  fVar44 = auVar17._12_4_;
  auVar63._12_4_ = auVar69._12_4_ * fVar44;
  auVar47 = vsubps_avx(auVar61,auVar63);
  auVar64._0_4_ = fVar46 * fVar46 + fVar45 * fVar45;
  auVar64._4_4_ = fVar37 * fVar37 + fVar58 * fVar58;
  auVar64._8_4_ = fVar43 * fVar43 + fVar59 * fVar59;
  auVar64._12_4_ = fVar44 * fVar44 + fVar60 * fVar60;
  auVar17 = vrcpps_avx(auVar64);
  fVar51 = auVar17._0_4_;
  auVar65._0_4_ = fVar51 * auVar64._0_4_;
  fVar52 = auVar17._4_4_;
  auVar65._4_4_ = fVar52 * auVar64._4_4_;
  fVar53 = auVar17._8_4_;
  auVar65._8_4_ = fVar53 * auVar64._8_4_;
  fVar54 = auVar17._12_4_;
  auVar65._12_4_ = fVar54 * auVar64._12_4_;
  auVar66._8_4_ = 0x3f800000;
  auVar66._0_8_ = &DAT_3f8000003f800000;
  auVar66._12_4_ = 0x3f800000;
  auVar17 = vsubps_avx(auVar66,auVar65);
  auVar62._0_4_ = auVar47._0_4_ * (fVar51 + fVar51 * auVar17._0_4_);
  auVar62._4_4_ = auVar47._4_4_ * (fVar52 + fVar52 * auVar17._4_4_);
  auVar62._8_4_ = auVar47._8_4_ * (fVar53 + fVar53 * auVar17._8_4_);
  auVar62._12_4_ = auVar47._12_4_ * (fVar54 + fVar54 * auVar17._12_4_);
  auVar17 = vminps_avx(auVar62,auVar66);
  auVar55 = ZEXT816(0) << 0x20;
  local_1e0 = vmaxps_avx(auVar17,auVar55);
  fVar77 = local_1e0._0_4_;
  fVar78 = local_1e0._4_4_;
  fVar79 = local_1e0._8_4_;
  fVar80 = local_1e0._12_4_;
  fVar46 = auVar69._0_4_ + fVar77 * fVar46;
  fVar51 = auVar69._4_4_ + fVar78 * fVar37;
  fVar52 = auVar69._8_4_ + fVar79 * fVar43;
  fVar53 = auVar69._12_4_ + fVar80 * fVar44;
  fVar54 = auVar71._0_4_ + fVar77 * fVar45;
  fVar58 = auVar71._4_4_ + fVar78 * fVar58;
  fVar59 = auVar71._8_4_ + fVar79 * fVar59;
  fVar60 = auVar71._12_4_ + fVar80 * fVar60;
  auVar17 = vsubps_avx(auVar39,auVar73);
  local_1c0._0_4_ = auVar73._0_4_ + fVar77 * auVar17._0_4_;
  local_1c0._4_4_ = auVar73._4_4_ + fVar78 * auVar17._4_4_;
  local_1c0._8_4_ = auVar73._8_4_ + fVar79 * auVar17._8_4_;
  local_1c0._12_4_ = auVar73._12_4_ + fVar80 * auVar17._12_4_;
  auVar17._4_4_ = fStack_1fc;
  auVar17._0_4_ = local_200;
  auVar17._8_4_ = fStack_1f8;
  auVar17._12_4_ = fStack_1f4;
  auVar17 = vsubps_avx(local_210,auVar17);
  fVar37 = local_200 + fVar77 * auVar17._0_4_;
  fVar43 = fStack_1fc + fVar78 * auVar17._4_4_;
  fVar44 = fStack_1f8 + fVar79 * auVar17._8_4_;
  fVar45 = fStack_1f4 + fVar80 * auVar17._12_4_;
  auVar48._0_4_ = fVar46 * fVar46 + fVar54 * fVar54;
  auVar48._4_4_ = fVar51 * fVar51 + fVar58 * fVar58;
  auVar48._8_4_ = fVar52 * fVar52 + fVar59 * fVar59;
  auVar48._12_4_ = fVar53 * fVar53 + fVar60 * fVar60;
  auVar56._0_4_ = fVar37 * fVar37;
  auVar56._4_4_ = fVar43 * fVar43;
  auVar56._8_4_ = fVar44 * fVar44;
  auVar56._12_4_ = fVar45 * fVar45;
  auVar47 = vcmpps_avx(auVar48,auVar56,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar17 = vcmpps_avx(auVar49,local_1c0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar38 = vcmpps_avx(local_1c0,auVar57,2);
  auVar17 = vandps_avx(auVar17,auVar38);
  auVar17 = vandnps_avx(_local_2a0,auVar17);
  fVar46 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
  auVar40._0_4_ = fVar46 * (fVar37 + fVar37);
  auVar40._4_4_ = fVar46 * (fVar43 + fVar43);
  auVar40._8_4_ = fVar46 * (fVar44 + fVar44);
  auVar40._12_4_ = fVar46 * (fVar45 + fVar45);
  auVar38 = vcmpps_avx(local_1c0,auVar40,6);
  auVar17 = vandps_avx(auVar17,auVar38);
  auVar38 = auVar47 & auVar17;
  if ((((auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar38[0xf] < '\0') {
    auVar17 = vandps_avx(auVar17,auVar47);
    local_1b0 = vsubps_avx(auVar5,_local_2e0);
    local_1a0 = vsubps_avx(auVar4,local_290);
    local_190 = vsubps_avx(_local_310,local_240);
    auVar47 = vcmpps_avx(auVar55,local_1b0,4);
    auVar38 = vcmpps_avx(auVar55,local_1a0,4);
    auVar38 = vorps_avx(auVar47,auVar38);
    auVar47 = vcmpps_avx(auVar55,local_190,4);
    auVar47 = vorps_avx(auVar38,auVar47);
    auVar17 = vandps_avx(auVar17,auVar47);
    iVar30 = vmovmskps_avx(auVar17);
    if (iVar30 != 0) {
      auVar67 = ZEXT864(0) << 0x20;
      local_1d0 = ZEXT816(0) << 0x20;
      uVar35 = (ulong)(byte)iVar30;
      uVar31 = 1 << ((byte)k & 0x1f);
      uVar34 = (ulong)((uVar31 & 0xf) << 4);
      lVar32 = (long)((int)uVar31 >> 4) * 0x10;
      auVar41 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar68 = ZEXT3264(auVar41);
      auVar70 = ZEXT3264(CONCAT428(0xff800000,
                                   CONCAT424(0xff800000,
                                             CONCAT420(0xff800000,
                                                       CONCAT416(0xff800000,
                                                                 CONCAT412(0xff800000,
                                                                           CONCAT48(0xff800000,
                                                                                                                                                                        
                                                  0xff800000ff800000)))))));
      local_278 = line;
      do {
        local_270.hit = local_180;
        local_270.valid = (int *)&local_2c0;
        uVar15 = 0;
        if (uVar35 != 0) {
          for (; (uVar35 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar31 = *(uint *)(local_1f0 + uVar15 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar31].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
          uVar35 = uVar35 ^ 1L << (uVar15 & 0x3f);
          bVar36 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar36 = false;
        }
        else {
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
          local_120 = *(undefined4 *)(local_1e0 + uVar15 * 4);
          uVar2 = *(undefined4 *)(local_1d0 + uVar15 * 4);
          local_100._4_4_ = uVar2;
          local_100._0_4_ = uVar2;
          local_100._8_4_ = uVar2;
          local_100._12_4_ = uVar2;
          local_100._16_4_ = uVar2;
          local_100._20_4_ = uVar2;
          local_100._24_4_ = uVar2;
          local_100._28_4_ = uVar2;
          *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1c0 + uVar15 * 4);
          local_270.context = context->user;
          uVar6 = (local_278->primIDs).field_0.i[uVar15];
          local_e0._4_4_ = uVar6;
          local_e0._0_4_ = uVar6;
          local_e0._8_4_ = uVar6;
          local_e0._12_4_ = uVar6;
          local_e0._16_4_ = uVar6;
          local_e0._20_4_ = uVar6;
          local_e0._24_4_ = uVar6;
          local_e0._28_4_ = uVar6;
          uVar2 = *(undefined4 *)(local_1b0 + uVar15 * 4);
          uVar3 = *(undefined4 *)(local_1a0 + uVar15 * 4);
          local_160._4_4_ = uVar3;
          local_160._0_4_ = uVar3;
          local_160._8_4_ = uVar3;
          local_160._12_4_ = uVar3;
          local_160._16_4_ = uVar3;
          local_160._20_4_ = uVar3;
          local_160._24_4_ = uVar3;
          local_160._28_4_ = uVar3;
          local_b0 = vpshufd_avx(ZEXT416(uVar31),0);
          uVar3 = *(undefined4 *)(local_190 + uVar15 * 4);
          local_140._4_4_ = uVar3;
          local_140._0_4_ = uVar3;
          local_140._8_4_ = uVar3;
          local_140._12_4_ = uVar3;
          local_140._16_4_ = uVar3;
          local_140._20_4_ = uVar3;
          local_140._24_4_ = uVar3;
          local_140._28_4_ = uVar3;
          local_180[0] = (RTCHitN)(char)uVar2;
          local_180[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[4] = (RTCHitN)(char)uVar2;
          local_180[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[8] = (RTCHitN)(char)uVar2;
          local_180[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0xc] = (RTCHitN)(char)uVar2;
          local_180[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x10] = (RTCHitN)(char)uVar2;
          local_180[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x14] = (RTCHitN)(char)uVar2;
          local_180[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x18] = (RTCHitN)(char)uVar2;
          local_180[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_180[0x1c] = (RTCHitN)(char)uVar2;
          local_180[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_180[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_180[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          uStack_11c = local_120;
          uStack_118 = local_120;
          uStack_114 = local_120;
          uStack_110 = local_120;
          uStack_10c = local_120;
          uStack_108 = local_120;
          uStack_104 = local_120;
          local_c0 = local_b0;
          uStack_9c = (local_270.context)->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = (local_270.context)->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          local_2c0 = *(undefined8 *)(mm_lookupmask_ps + uVar34);
          uStack_2b8 = *(undefined8 *)(mm_lookupmask_ps + uVar34 + 8);
          local_2b0 = *(undefined8 *)(mm_lookupmask_ps + lVar32);
          uStack_2a8 = *(undefined8 *)(mm_lookupmask_ps + lVar32 + 8);
          local_270.geometryUserPtr = pGVar11->userPtr;
          local_270.N = 8;
          local_270.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar11->occlusionFilterN)(&local_270);
            auVar70 = ZEXT3264(CONCAT428(0xff800000,
                                         CONCAT424(0xff800000,
                                                   CONCAT420(0xff800000,
                                                             CONCAT416(0xff800000,
                                                                       CONCAT412(0xff800000,
                                                                                 CONCAT48(0xff800000
                                                                                          ,
                                                  0xff800000ff800000)))))));
            auVar68 = ZEXT3264(auVar68._0_32_);
            auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar26._8_8_ = uStack_2b8;
          auVar26._0_8_ = local_2c0;
          auVar17 = vpcmpeqd_avx(auVar67._0_16_,auVar26);
          auVar28._8_8_ = uStack_2a8;
          auVar28._0_8_ = local_2b0;
          auVar47 = vpcmpeqd_avx(auVar67._0_16_,auVar28);
          auVar41._16_16_ = auVar47;
          auVar41._0_16_ = auVar17;
          auVar41 = auVar68._0_32_ & ~auVar41;
          if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar41 >> 0x7f,0) == '\0') &&
                (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar41 >> 0xbf,0) == '\0') &&
              (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar41[0x1f]) {
            auVar42._0_4_ = auVar68._0_4_ ^ auVar17._0_4_;
            auVar42._4_4_ = auVar68._4_4_ ^ auVar17._4_4_;
            auVar42._8_4_ = auVar68._8_4_ ^ auVar17._8_4_;
            auVar42._12_4_ = auVar68._12_4_ ^ auVar17._12_4_;
            auVar42._16_4_ = auVar68._16_4_ ^ auVar47._0_4_;
            auVar42._20_4_ = auVar68._20_4_ ^ auVar47._4_4_;
            auVar42._24_4_ = auVar68._24_4_ ^ auVar47._8_4_;
            auVar42._28_4_ = auVar68._28_4_ ^ auVar47._12_4_;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_270);
              auVar70 = ZEXT3264(CONCAT428(0xff800000,
                                           CONCAT424(0xff800000,
                                                     CONCAT420(0xff800000,
                                                               CONCAT416(0xff800000,
                                                                         CONCAT412(0xff800000,
                                                                                   CONCAT48(
                                                  0xff800000,0xff800000ff800000)))))));
              auVar68 = ZEXT3264(auVar68._0_32_);
              auVar67 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar27._8_8_ = uStack_2b8;
            auVar27._0_8_ = local_2c0;
            auVar17 = vpcmpeqd_avx(auVar67._0_16_,auVar27);
            auVar29._8_8_ = uStack_2a8;
            auVar29._0_8_ = local_2b0;
            auVar47 = vpcmpeqd_avx(auVar67._0_16_,auVar29);
            auVar50._16_16_ = auVar47;
            auVar50._0_16_ = auVar17;
            auVar42._0_4_ = auVar68._0_4_ ^ auVar17._0_4_;
            auVar42._4_4_ = auVar68._4_4_ ^ auVar17._4_4_;
            auVar42._8_4_ = auVar68._8_4_ ^ auVar17._8_4_;
            auVar42._12_4_ = auVar68._12_4_ ^ auVar17._12_4_;
            auVar42._16_4_ = auVar68._16_4_ ^ auVar47._0_4_;
            auVar42._20_4_ = auVar68._20_4_ ^ auVar47._4_4_;
            auVar42._24_4_ = auVar68._24_4_ ^ auVar47._8_4_;
            auVar42._28_4_ = auVar68._28_4_ ^ auVar47._12_4_;
            auVar41 = vblendvps_avx(auVar70._0_32_,*(undefined1 (*) [32])(local_270.ray + 0x100),
                                    auVar50);
            *(undefined1 (*) [32])(local_270.ray + 0x100) = auVar41;
          }
          bVar24 = (auVar42 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar25 = (auVar42 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar23 = (auVar42 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
          bVar22 = SUB321(auVar42 >> 0x7f,0) == '\0';
          bVar21 = (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar20 = SUB321(auVar42 >> 0xbf,0) == '\0';
          bVar19 = (auVar42 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
          bVar18 = -1 < auVar42[0x1f];
          bVar36 = ((((((bVar24 && bVar25) && bVar23) && bVar22) && bVar21) && bVar20) && bVar19) &&
                   bVar18;
          if (((((((bVar24 && bVar25) && bVar23) && bVar22) && bVar21) && bVar20) && bVar19) &&
              bVar18) {
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
            uVar35 = uVar35 ^ 1L << (uVar15 & 0x3f);
          }
        }
      } while ((bVar36 != false) && (uVar35 != 0));
      return (bool)(bVar36 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }